

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v9::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,bool value)

{
  appender aVar1;
  basic_format_specs<char> local_10;
  
  local_10.width = 0;
  local_10.precision = -1;
  local_10.type = none;
  local_10._9_2_ = 0;
  local_10.fill.data_[0] = ' ';
  local_10.fill.data_[1] = '\0';
  local_10.fill.data_[2] = '\0';
  local_10.fill.data_[3] = '\0';
  local_10.fill.size_ = '\x01';
  aVar1 = write<char,_fmt::v9::appender,_bool,_0>
                    ((appender)
                     (this->out).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                     container,value,&local_10,(locale_ref)0x0);
  return (iterator)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }